

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

int x25519_key_exchange(ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,
                       ptls_iovec_t *secret,ptls_iovec_t peerkey)

{
  ptls_iovec_t pVar1;
  uint8_t *local_78;
  size_t local_70;
  int local_64;
  uint8_t *puStack_60;
  int ret;
  uint8_t *pub;
  uint8_t priv [32];
  ptls_iovec_t *secret_local;
  ptls_iovec_t *pubkey_local;
  ptls_key_exchange_algorithm_t *algo_local;
  ptls_iovec_t peerkey_local;
  
  puStack_60 = (uint8_t *)0x0;
  if (peerkey.len == 0x20) {
    puStack_60 = (uint8_t *)malloc(0x20);
    if (puStack_60 == (uint8_t *)0x0) {
      local_64 = 0x201;
    }
    else {
      x25519_create_keypair((uint8_t *)&pub,puStack_60);
      local_64 = x25519_derive_secret(secret,(uint8_t *)0x0,peerkey.base,(uint8_t *)&pub,puStack_60)
      ;
      if (local_64 == 0) {
        pVar1 = ptls_iovec_init(puStack_60,0x20);
        local_78 = pVar1.base;
        pubkey->base = local_78;
        local_70 = pVar1.len;
        pubkey->len = local_70;
        local_64 = 0;
      }
    }
  }
  else {
    local_64 = 0x33;
  }
  (*ptls_clear_memory)(&pub,0x20);
  if ((puStack_60 != (uint8_t *)0x0) && (local_64 != 0)) {
    (*ptls_clear_memory)(puStack_60,0x20);
  }
  return local_64;
}

Assistant:

static int x25519_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret,
                               ptls_iovec_t peerkey)
{
    uint8_t priv[X25519_KEY_SIZE], *pub = NULL;
    int ret;

    if (peerkey.len != X25519_KEY_SIZE) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((pub = malloc(X25519_KEY_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    x25519_create_keypair(priv, pub);
    if ((ret = x25519_derive_secret(secret, NULL, peerkey.base, priv, pub)) != 0)
        goto Exit;

    *pubkey = ptls_iovec_init(pub, X25519_KEY_SIZE);
    ret = 0;

Exit:
    ptls_clear_memory(priv, sizeof(priv));
    if (pub != NULL && ret != 0)
        ptls_clear_memory(pub, X25519_KEY_SIZE);
    return ret;
}